

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O0

GLValue deqp::gls::anon_unknown_1::GLValue::getMinValue(InputType type)

{
  Half value;
  GLValue GVar1;
  GLValue *local_1e0;
  anon_union_8_10_1f5805e9_for_GLValue_1 local_1d0;
  GLValue GStack_1c8;
  anon_union_8_10_1f5805e9_for_GLValue_1 local_1b8;
  GLValue GStack_1b0;
  anon_union_8_10_1f5805e9_for_GLValue_1 local_1a0;
  GLValue GStack_198;
  anon_union_8_10_1f5805e9_for_GLValue_1 local_188;
  GLValue GStack_180;
  anon_union_8_10_1f5805e9_for_GLValue_1 local_170;
  GLValue GStack_168;
  anon_union_8_10_1f5805e9_for_GLValue_1 local_158;
  GLValue GStack_150;
  anon_union_8_10_1f5805e9_for_GLValue_1 local_140;
  GLValue GStack_138;
  anon_union_8_10_1f5805e9_for_GLValue_1 local_128;
  GLValue GStack_120;
  anon_union_8_10_1f5805e9_for_GLValue_1 local_110;
  undefined1 auStack_108 [16];
  GLValue local_f8;
  undefined1 auStack_e8 [8];
  GLValue rangesLo [12];
  InputType type_local;
  
  local_1e0 = (GLValue *)auStack_e8;
  do {
    GLValue(local_1e0);
    local_1e0 = local_1e0 + 1;
  } while (local_1e0 != (GLValue *)&rangesLo[0xb].field_1);
  auStack_108._12_4_ = WrappedType<float>::create(-127.0);
  GLValue(&local_f8,(Float)auStack_108._12_4_);
  auStack_e8 = (undefined1  [8])local_f8._0_8_;
  rangesLo[0]._0_8_ = local_f8.field_1;
  GStack_120.field_1.d.m_value = WrappedType<double>::create(-127.0);
  GLValue((GLValue *)&local_110.fl,GStack_120.field_1.d.m_value);
  rangesLo[1].field_1 = local_110;
  rangesLo[2]._0_8_ = auStack_108._0_8_;
  GStack_138.field_1._7_1_ = WrappedType<signed_char>::create(-0x7f);
  GLValue((GLValue *)&local_128.fl,(Byte)GStack_138.field_1._7_1_);
  rangesLo[2].field_1 = local_128;
  rangesLo[3].type = GStack_120.type;
  rangesLo[3]._4_4_ = GStack_120._4_4_;
  GStack_150.field_1._7_1_ = WrappedType<unsigned_char>::create('\0');
  GLValue((GLValue *)&local_140.fl,(Ubyte)GStack_150.field_1._7_1_);
  rangesLo[4].field_1 = local_140;
  rangesLo[5].type = GStack_138.type;
  rangesLo[5]._4_4_ = GStack_138._4_4_;
  GStack_168.field_1._6_2_ = WrappedType<unsigned_short>::create(0);
  GLValue((GLValue *)&local_158.fl,(Ushort)GStack_168.field_1._6_2_);
  rangesLo[5].field_1 = local_158;
  rangesLo[6].type = GStack_150.type;
  rangesLo[6]._4_4_ = GStack_150._4_4_;
  GStack_180.field_1._6_2_ = WrappedType<short>::create(-0x7ff8);
  GLValue((GLValue *)&local_170.fl,(Short)GStack_180.field_1._6_2_);
  rangesLo[3].field_1 = local_170;
  rangesLo[4].type = GStack_168.type;
  rangesLo[4]._4_4_ = GStack_168._4_4_;
  GStack_198.field_1._4_4_ = Fixed::create(-0x7ff8);
  GLValue((GLValue *)&local_188.fl,(Fixed)GStack_198.field_1._4_4_);
  rangesLo[0].field_1 = local_188;
  rangesLo[1].type = GStack_180.type;
  rangesLo[1]._4_4_ = GStack_180._4_4_;
  GStack_1b0.field_1._4_4_ = WrappedType<int>::create(-0x7fffffff);
  GLValue((GLValue *)&local_1a0.fl,(Int)GStack_1b0.field_1._4_4_);
  rangesLo[6].field_1 = local_1a0;
  rangesLo[7].type = GStack_198.type;
  rangesLo[7]._4_4_ = GStack_198._4_4_;
  GStack_1c8.field_1._4_4_ = WrappedType<unsigned_int>::create(0);
  GLValue((GLValue *)&local_1b8.fl,(Uint)GStack_1c8.field_1._4_4_);
  rangesLo[7].field_1 = local_1b8;
  rangesLo[8].type = GStack_1b0.type;
  rangesLo[8]._4_4_ = GStack_1b0._4_4_;
  value = Half::create(-256.0);
  GLValue((GLValue *)&local_1d0.fl,value);
  rangesLo[8].field_1 = local_1d0;
  rangesLo[9].type = GStack_1c8.type;
  rangesLo[9]._4_4_ = GStack_1c8._4_4_;
  GVar1._0_8_ = (ulong)rangesLo[(long)(int)type + -1].field_1 & 0xffffffff;
  GVar1.field_1 = *(anon_union_8_10_1f5805e9_for_GLValue_1 *)(rangesLo + (int)type);
  return GVar1;
}

Assistant:

GLValue GLValue::getMinValue (DrawTestSpec::InputType type)
{
	GLValue rangesLo[(int)DrawTestSpec::INPUTTYPE_LAST];

	rangesLo[(int)DrawTestSpec::INPUTTYPE_FLOAT]			= GLValue(Float::create(-127.0f));
	rangesLo[(int)DrawTestSpec::INPUTTYPE_DOUBLE]			= GLValue(Double::create(-127.0f));
	rangesLo[(int)DrawTestSpec::INPUTTYPE_BYTE]				= GLValue(Byte::create(-127));
	rangesLo[(int)DrawTestSpec::INPUTTYPE_UNSIGNED_BYTE]	= GLValue(Ubyte::create(0));
	rangesLo[(int)DrawTestSpec::INPUTTYPE_UNSIGNED_SHORT]	= GLValue(Ushort::create(0));
	rangesLo[(int)DrawTestSpec::INPUTTYPE_SHORT]			= GLValue(Short::create(-32760));
	rangesLo[(int)DrawTestSpec::INPUTTYPE_FIXED]			= GLValue(Fixed::create(-32760));
	rangesLo[(int)DrawTestSpec::INPUTTYPE_INT]				= GLValue(Int::create(-2147483647));
	rangesLo[(int)DrawTestSpec::INPUTTYPE_UNSIGNED_INT]		= GLValue(Uint::create(0));
	rangesLo[(int)DrawTestSpec::INPUTTYPE_HALF]				= GLValue(Half::create(-256.0f));

	return rangesLo[(int)type];
}